

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

int32_t getIndex2Block(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  int local_28;
  int32_t i2;
  int32_t i1;
  UBool forLSCP_local;
  UChar32 c_local;
  UNewTrie2 *trie_local;
  
  if (((c & 0xfffffc00U) == 0xd800) && (forLSCP != '\0')) {
    trie_local._4_4_ = 0x800;
  }
  else {
    local_28 = trie->index1[c >> 0xb];
    if (local_28 == trie->index2NullOffset) {
      local_28 = allocIndex2Block(trie);
      if (local_28 < 0) {
        return -1;
      }
      trie->index1[c >> 0xb] = local_28;
    }
    trie_local._4_4_ = local_28;
  }
  return trie_local._4_4_;
}

Assistant:

static int32_t
getIndex2Block(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i1, i2;

    if(U_IS_LEAD(c) && forLSCP) {
        return UTRIE2_LSCP_INDEX_2_OFFSET;
    }

    i1=c>>UTRIE2_SHIFT_1;
    i2=trie->index1[i1];
    if(i2==trie->index2NullOffset) {
        i2=allocIndex2Block(trie);
        if(i2<0) {
            return -1;  /* program error */
        }
        trie->index1[i1]=i2;
    }
    return i2;
}